

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryReporterPlugin_mallocAllocationsAreReportedTest_Test::
~TEST_MemoryReporterPlugin_mallocAllocationsAreReportedTest_Test
          (TEST_MemoryReporterPlugin_mallocAllocationsAreReportedTest_Test *this)

{
  TEST_MemoryReporterPlugin_mallocAllocationsAreReportedTest_Test *this_local;
  
  ~TEST_MemoryReporterPlugin_mallocAllocationsAreReportedTest_Test(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST(MemoryReporterPlugin, mallocAllocationsAreReportedTest)
{
    mock("formatter").expectOneCall("report_alloc_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getMallocAllocator());
    mock("formatter").expectOneCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getMallocAllocator());
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(*test, *result);
    char *memory = getCurrentMallocAllocator()->allocMemoryLeakNode(100);
    getCurrentMallocAllocator()->free_memory(memory, 100, "unknown", 1);
}